

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

void yaml_event_delete(yaml_event_t *event)

{
  yaml_version_directive_t *pyVar1;
  yaml_tag_directive_t *pyVar2;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x3dd,"void yaml_event_delete(yaml_event_t *)");
  }
  switch(event->type) {
  case YAML_DOCUMENT_START_EVENT:
    pyVar1 = (event->data).document_start.version_directive;
    if (pyVar1 != (yaml_version_directive_t *)0x0) {
      free(pyVar1);
    }
    for (pyVar2 = (event->data).document_start.tag_directives.start;
        pyVar2 != (event->data).document_start.tag_directives.end; pyVar2 = pyVar2 + 1) {
      if (pyVar2->handle != (yaml_char_t *)0x0) {
        free(pyVar2->handle);
      }
      if (pyVar2->prefix != (yaml_char_t *)0x0) {
        free(pyVar2->prefix);
      }
    }
    goto LAB_00103ba5;
  default:
    goto switchD_00103b95_caseD_4;
  case YAML_ALIAS_EVENT:
    pyVar2 = (yaml_tag_directive_t *)(event->data).document_start.version_directive;
    break;
  case YAML_SCALAR_EVENT:
    pyVar1 = (event->data).document_start.version_directive;
    if (pyVar1 != (yaml_version_directive_t *)0x0) {
      free(pyVar1);
    }
    pyVar2 = (event->data).document_start.tag_directives.start;
    if (pyVar2 != (yaml_tag_directive_t *)0x0) {
      free(pyVar2);
    }
    pyVar2 = (event->data).document_start.tag_directives.end;
    break;
  case YAML_SEQUENCE_START_EVENT:
  case YAML_MAPPING_START_EVENT:
    pyVar1 = (event->data).document_start.version_directive;
    if (pyVar1 != (yaml_version_directive_t *)0x0) {
      free(pyVar1);
    }
LAB_00103ba5:
    pyVar2 = (event->data).document_start.tag_directives.start;
  }
  if (pyVar2 != (yaml_tag_directive_t *)0x0) {
    free(pyVar2);
  }
switchD_00103b95_caseD_4:
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).column = 0;
  return;
}

Assistant:

YAML_DECLARE(void)
yaml_event_delete(yaml_event_t *event)
{
    yaml_tag_directive_t *tag_directive;

    assert(event);  /* Non-NULL event object expected. */

    switch (event->type)
    {
        case YAML_DOCUMENT_START_EVENT:
            yaml_free(event->data.document_start.version_directive);
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive++) {
                yaml_free(tag_directive->handle);
                yaml_free(tag_directive->prefix);
            }
            yaml_free(event->data.document_start.tag_directives.start);
            break;

        case YAML_ALIAS_EVENT:
            yaml_free(event->data.alias.anchor);
            break;

        case YAML_SCALAR_EVENT:
            yaml_free(event->data.scalar.anchor);
            yaml_free(event->data.scalar.tag);
            yaml_free(event->data.scalar.value);
            break;

        case YAML_SEQUENCE_START_EVENT:
            yaml_free(event->data.sequence_start.anchor);
            yaml_free(event->data.sequence_start.tag);
            break;

        case YAML_MAPPING_START_EVENT:
            yaml_free(event->data.mapping_start.anchor);
            yaml_free(event->data.mapping_start.tag);
            break;

        default:
            break;
    }

    memset(event, 0, sizeof(yaml_event_t));
}